

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Expression * __thiscall
wasm::Builder::replaceWithIdenticalType<wasm::Block>(Builder *this,Block *curr)

{
  Type *this_00;
  bool bVar1;
  Shareability share;
  BasicType BVar2;
  Expression *pEVar3;
  HeapType type_00;
  RefI31 *expr;
  Const *value_00;
  Type type_01;
  Nop *output;
  SmallVector<wasm::Literal,_1UL> local_d0;
  uint8_t auStack_98 [8];
  array<unsigned_char,_16UL> bytes;
  Type type;
  undefined1 local_68 [8];
  anon_class_16_2_3fee0b3d maybeWrap;
  Literal value;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type;
  type_01.id = (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  local_68 = (undefined1  [8])(bytes._M_elems + 8);
  bytes._M_elems._8_8_ = type_01.id;
  maybeWrap.type = (Type *)this;
  if ((type_01.id & 1) != 0 && 6 < type_01.id) {
    bVar1 = wasm::Type::isDefaultable(this_00);
    type_01.id = this_00->id;
    if (bVar1) {
      Literal::makeZeros((Literals *)&local_d0,type_01);
      pEVar3 = makeConstantExpression(this,(Literals *)&local_d0);
      pEVar3 = replaceWithIdenticalType<wasm::Block>::anon_class_16_2_3fee0b3d::operator()
                         ((anon_class_16_2_3fee0b3d *)local_68,pEVar3);
      SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_d0);
      return pEVar3;
    }
  }
  if (((uint)type_01.id & 3) == 2 && 6 < type_01.id) {
    type_00 = wasm::Type::getHeapType(this_00);
    expr = (RefI31 *)ExpressionManipulator::refNull<wasm::Block>(curr,type_00);
LAB_00bfccef:
    pEVar3 = replaceWithIdenticalType<wasm::Block>::anon_class_16_2_3fee0b3d::operator()
                       ((anon_class_16_2_3fee0b3d *)local_68,(Expression *)expr);
    return pEVar3;
  }
  if ((type_01.id & 1) == 0 && 6 < type_01.id) {
    maybeWrap.this = (Builder *)wasm::Type::getHeapType(this_00);
    bVar1 = HeapType::isMaybeShared((HeapType *)&maybeWrap.this,i31);
    if (bVar1) {
      value_00 = makeConst<int>(this,0);
      maybeWrap.this = (Builder *)wasm::Type::getHeapType(this_00);
      share = HeapType::getShared((HeapType *)&maybeWrap.this);
      expr = makeRefI31(this,(Expression *)value_00,share);
      goto LAB_00bfccef;
    }
    type_01.id = this_00->id;
  }
  if (6 < type_01.id) {
    return (Expression *)curr;
  }
  maybeWrap.this = (Builder *)0x0;
  BVar2 = wasm::Type::getBasic(this_00);
  switch(BVar2) {
  case none:
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    goto LAB_00bfce74;
  case unreachable:
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnreachableId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
    goto LAB_00bfce74;
  case i32:
    local_38.func.super_IString.str._M_len =
         (ulong)(uint)local_38.func.super_IString.str._M_len._4_4_ << 0x20;
    local_28 = 2;
    Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case i64:
    local_38.i64 = 0;
    local_28 = 3;
    Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case f32:
    local_38.func.super_IString.str._M_len =
         (ulong)(uint)local_38.func.super_IString.str._M_len._4_4_ << 0x20;
    local_28 = 4;
    Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case f64:
    local_38.i64 = 0;
    local_28 = 5;
    Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case v128:
    auStack_98[0] = '\0';
    auStack_98[1] = '\0';
    auStack_98[2] = '\0';
    auStack_98[3] = '\0';
    auStack_98[4] = '\0';
    auStack_98[5] = '\0';
    auStack_98[6] = '\0';
    auStack_98[7] = '\0';
    bytes._M_elems[0] = '\0';
    bytes._M_elems[1] = '\0';
    bytes._M_elems[2] = '\0';
    bytes._M_elems[3] = '\0';
    bytes._M_elems[4] = '\0';
    bytes._M_elems[5] = '\0';
    bytes._M_elems[6] = '\0';
    bytes._M_elems[7] = '\0';
    Literal::Literal((Literal *)&local_38.func,auStack_98);
    Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  default:
    goto switchD_00bfcd98_default;
  }
  Literal::~Literal((Literal *)&local_38.func);
switchD_00bfcd98_default:
  Literal::Literal((Literal *)&type,(Literal *)&maybeWrap.this);
  curr = (Block *)makeConst(this,(Literal *)&type);
  Literal::~Literal((Literal *)&type);
LAB_00bfce74:
  Literal::~Literal((Literal *)&maybeWrap.this);
  return (Expression *)curr;
}

Assistant:

Expression* replaceWithIdenticalType(T* curr) {
    auto type = curr->type;
    // Anything that would otherwise have a more refined type than the original
    // expression needs to be wrapped in a block with the original type.
    auto maybeWrap = [&](Expression* expr) -> Expression* {
      return expr->type == type ? expr : makeBlock({expr}, type);
    };
    if (curr->type.isTuple() && curr->type.isDefaultable()) {
      return maybeWrap(makeConstantExpression(Literal::makeZeros(curr->type)));
    }
    if (curr->type.isNullable()) {
      return maybeWrap(
        ExpressionManipulator::refNull(curr, curr->type.getHeapType()));
    }
    if (curr->type.isRef() &&
        curr->type.getHeapType().isMaybeShared(HeapType::i31)) {
      return maybeWrap(
        makeRefI31(makeConst(0), curr->type.getHeapType().getShared()));
    }
    if (!curr->type.isBasic()) {
      // We can't do any better, keep the original.
      return curr;
    }
    Literal value;
    // TODO: reuse node conditionally when possible for literals
    switch (curr->type.getBasic()) {
      case Type::i32:
        value = Literal(int32_t(0));
        break;
      case Type::i64:
        value = Literal(int64_t(0));
        break;
      case Type::f32:
        value = Literal(float(0));
        break;
      case Type::f64:
        value = Literal(double(0));
        break;
      case Type::v128: {
        std::array<uint8_t, 16> bytes;
        bytes.fill(0);
        value = Literal(bytes.data());
        break;
      }
      case Type::none:
        return ExpressionManipulator::nop(curr);
      case Type::unreachable:
        return ExpressionManipulator::unreachable(curr);
    }
    return makeConst(value);
  }